

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O3

void __thiscall diy::Bounds<float>::Bounds(Bounds<float> *this,int dim)

{
  allocator<float> local_22;
  allocator<float> local_21;
  float local_20;
  float local_1c;
  
  local_20 = 0.0;
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::small_vector
            ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)this,(long)dim,&local_20,
             &local_22);
  local_1c = 0.0;
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::small_vector
            (&(this->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>,(long)dim,
             &local_1c,&local_21);
  return;
}

Assistant:

Bounds(int dim): min(dim), max(dim)                                 {}